

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void unixepochFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  long in_FS_OFFSET;
  undefined1 local_48 [16];
  undefined1 *local_38;
  undefined1 *puStack_30;
  double local_28;
  undefined1 *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = -NAN;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  iVar1 = isDate(context,argc,argv,(DateTime *)local_48);
  if (iVar1 == 0) {
    computeJD((DateTime *)local_48);
    if (((ulong)local_20 & 0x400000000) == 0) {
      sqlite3_result_int64(context,(long)local_48._0_8_ / 1000 + -0x3118a36940);
    }
    else {
      sqlite3_result_double(context,(double)(long)(local_48._0_8_ + -0xbfc83e532200) / 1000.0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void unixepochFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    computeJD(&x);
    if( x.useSubsec ){
      sqlite3_result_double(context, (x.iJD - 21086676*(i64)10000000)/1000.0);
    }else{
      sqlite3_result_int64(context, x.iJD/1000 - 21086676*(i64)10000);
    }
  }
}